

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1afbd7e::MinMaxTest_MinValue_Test::TestBody(MinMaxTest_MinValue_Test *this)

{
  undefined8 *puVar1;
  SEARCH_METHODS *pSVar2;
  undefined2 in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  Message local_100;
  int local_f4;
  RegisterStateCheckMMX reg_check_mmx;
  AssertHelper local_d0;
  MinMaxTest_MinValue_Test *local_c8;
  int max;
  int min;
  uint8_t b [64];
  uint8_t a [64];
  
  local_c8 = this;
  for (local_f4 = 0; reg_check_mmx.pre_fpu_env_[0]._0_1_ = (char)in_FPUControlWord, local_f4 < 0x40;
      local_f4 = local_f4 + 1) {
    a[0] = '\0';
    a[1] = '\0';
    a[2] = '\0';
    a[3] = '\0';
    a[4] = '\0';
    a[5] = '\0';
    a[6] = '\0';
    a[7] = '\0';
    a[8] = '\0';
    a[9] = '\0';
    a[10] = '\0';
    a[0xb] = '\0';
    a[0xc] = '\0';
    a[0xd] = '\0';
    a[0xe] = '\0';
    a[0xf] = '\0';
    a[0x10] = '\0';
    a[0x11] = '\0';
    a[0x12] = '\0';
    a[0x13] = '\0';
    a[0x14] = '\0';
    a[0x15] = '\0';
    a[0x16] = '\0';
    a[0x17] = '\0';
    a[0x18] = '\0';
    a[0x19] = '\0';
    a[0x1a] = '\0';
    a[0x1b] = '\0';
    a[0x1c] = '\0';
    a[0x1d] = '\0';
    a[0x1e] = '\0';
    a[0x1f] = '\0';
    a[0x20] = '\0';
    a[0x21] = '\0';
    a[0x22] = '\0';
    a[0x23] = '\0';
    a[0x24] = '\0';
    a[0x25] = '\0';
    a[0x26] = '\0';
    a[0x27] = '\0';
    a[0x28] = '\0';
    a[0x29] = '\0';
    a[0x2a] = '\0';
    a[0x2b] = '\0';
    a[0x2c] = '\0';
    a[0x2d] = '\0';
    a[0x2e] = '\0';
    a[0x2f] = '\0';
    a[0x30] = '\0';
    a[0x31] = '\0';
    a[0x32] = '\0';
    a[0x33] = '\0';
    a[0x34] = '\0';
    a[0x35] = '\0';
    a[0x36] = '\0';
    a[0x37] = '\0';
    a[0x38] = '\0';
    a[0x39] = '\0';
    a[0x3a] = '\0';
    a[0x3b] = '\0';
    a[0x3c] = '\0';
    a[0x3d] = '\0';
    a[0x3e] = '\0';
    a[0x3f] = '\0';
    b[0] = 0xff;
    b[1] = 0xff;
    b[2] = 0xff;
    b[3] = 0xff;
    b[4] = 0xff;
    b[5] = 0xff;
    b[6] = 0xff;
    b[7] = 0xff;
    b[8] = 0xff;
    b[9] = 0xff;
    b[10] = 0xff;
    b[0xb] = 0xff;
    b[0xc] = 0xff;
    b[0xd] = 0xff;
    b[0xe] = 0xff;
    b[0xf] = 0xff;
    b[0x10] = 0xff;
    b[0x11] = 0xff;
    b[0x12] = 0xff;
    b[0x13] = 0xff;
    b[0x14] = 0xff;
    b[0x15] = 0xff;
    b[0x16] = 0xff;
    b[0x17] = 0xff;
    b[0x18] = 0xff;
    b[0x19] = 0xff;
    b[0x1a] = 0xff;
    b[0x1b] = 0xff;
    b[0x1c] = 0xff;
    b[0x1d] = 0xff;
    b[0x1e] = 0xff;
    b[0x1f] = 0xff;
    b[0x20] = 0xff;
    b[0x21] = 0xff;
    b[0x22] = 0xff;
    b[0x23] = 0xff;
    b[0x24] = 0xff;
    b[0x25] = 0xff;
    b[0x26] = 0xff;
    b[0x27] = 0xff;
    b[0x28] = 0xff;
    b[0x29] = 0xff;
    b[0x2a] = 0xff;
    b[0x2b] = 0xff;
    b[0x2c] = 0xff;
    b[0x2d] = 0xff;
    b[0x2e] = 0xff;
    b[0x2f] = 0xff;
    b[0x30] = 0xff;
    b[0x31] = 0xff;
    b[0x32] = 0xff;
    b[0x33] = 0xff;
    b[0x34] = 0xff;
    b[0x35] = 0xff;
    b[0x36] = 0xff;
    b[0x37] = 0xff;
    b[0x38] = 0xff;
    b[0x39] = 0xff;
    b[0x3a] = 0xff;
    b[0x3b] = 0xff;
    b[0x3c] = 0xff;
    b[0x3d] = 0xff;
    b[0x3e] = 0xff;
    b[0x3f] = 0xff;
    b[local_f4] = (uint8_t)local_f4;
    reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
    reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
    reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
    (*(local_c8->super_MinMaxTest).mm_func_)(a,8,b,8,&min,&max);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
    local_100.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0xff;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&reg_check_mmx,"255","max",(int *)&local_100,&max);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message(&local_100);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar2 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar2 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/minmax_test.cc"
                 ,0x45,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_d0,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((long *)CONCAT44(local_100.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_100.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_100.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_100.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(reg_check_mmx.pre_fpu_env_ + 4));
    testing::internal::CmpHelperEQ<int,int>((internal *)&reg_check_mmx,"i","min",&local_f4,&min);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message(&local_100);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar2 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar2 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/minmax_test.cc"
                 ,0x46,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_d0,&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      if ((long *)CONCAT44(local_100.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_100.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_100.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_100.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(reg_check_mmx.pre_fpu_env_ + 4));
  }
  return;
}

Assistant:

TEST_P(MinMaxTest, MinValue) {
  for (int i = 0; i < 64; i++) {
    uint8_t a[64], b[64];
    memset(a, 0, sizeof(a));
    memset(b, 255, sizeof(b));
    b[i] = i;  // Set a minimum difference of i.

    int min, max;
    API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
    EXPECT_EQ(255, max);
    EXPECT_EQ(i, min);
  }
}